

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O2

void __thiscall CCheckQueue<FakeCheck>::~CCheckQueue(CCheckQueue<FakeCheck> *this)

{
  long lVar1;
  thread *t;
  long lVar2;
  long in_FS_OFFSET;
  anon_class_8_1_8991fb9c local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.this = (CCheckQueue<FakeCheckCheckCompletion> *)this;
  ~CCheckQueue::anon_class_8_1_8991fb9c::operator()(&local_38);
  std::condition_variable::notify_all();
  lVar1 = *(long *)(this + 0xc0);
  for (lVar2 = *(long *)(this + 0xb8); lVar2 != lVar1; lVar2 = lVar2 + 8) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)(this + 0xb8));
  std::_Vector_base<FakeCheck,_std::allocator<FakeCheck>_>::~_Vector_base
            ((_Vector_base<FakeCheck,_std::allocator<FakeCheck>_> *)(this + 0x88));
  std::condition_variable::~condition_variable((condition_variable *)(this + 0x58));
  std::condition_variable::~condition_variable((condition_variable *)(this + 0x28));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~CCheckQueue()
    {
        WITH_LOCK(m_mutex, m_request_stop = true);
        m_worker_cv.notify_all();
        for (std::thread& t : m_worker_threads) {
            t.join();
        }
    }